

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging.c
# Opt level: O0

AMQP_VALUE
messaging_delivery_modified
          (_Bool delivery_failed,_Bool undeliverable_here,fields message_annotations)

{
  int iVar1;
  MODIFIED_HANDLE modified_00;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  MODIFIED_HANDLE modified;
  AMQP_VALUE result;
  fields message_annotations_local;
  _Bool undeliverable_here_local;
  _Bool delivery_failed_local;
  
  modified_00 = modified_create();
  if (modified_00 == (MODIFIED_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/messaging.c"
                ,"messaging_delivery_modified",0x102,1,
                "Cannot create MODIFIED delivery state handle");
    }
    modified = (MODIFIED_HANDLE)0x0;
  }
  else {
    iVar1 = modified_set_delivery_failed(modified_00,delivery_failed);
    if (iVar1 == 0) {
      iVar1 = modified_set_undeliverable_here(modified_00,undeliverable_here);
      if (iVar1 == 0) {
        if ((message_annotations == (fields)0x0) ||
           (iVar1 = modified_set_message_annotations(modified_00,message_annotations), iVar1 == 0))
        {
          modified = (MODIFIED_HANDLE)amqpvalue_create_modified(modified_00);
          if (((AMQP_VALUE)modified == (AMQP_VALUE)0x0) &&
             (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/messaging.c"
                      ,"messaging_delivery_modified",0x11b,1,
                      "Cannot create MODIFIED delivery state AMQP value");
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/messaging.c"
                      ,"messaging_delivery_modified",0x113,1,
                      "Cannot set message annotations on MODIFIED delivery state");
          }
          modified = (MODIFIED_HANDLE)0x0;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/messaging.c"
                    ,"messaging_delivery_modified",0x10e,1,
                    "Cannot set undeliverable here on MODIFIED delivery state");
        }
        modified = (MODIFIED_HANDLE)0x0;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/messaging.c"
                  ,"messaging_delivery_modified",0x109,1,
                  "Cannot set delivery failed on MODIFIED delivery state");
      }
      modified = (MODIFIED_HANDLE)0x0;
    }
    modified_destroy(modified_00);
  }
  return (AMQP_VALUE)modified;
}

Assistant:

AMQP_VALUE messaging_delivery_modified(bool delivery_failed, bool undeliverable_here, fields message_annotations)
{
    AMQP_VALUE result;
    MODIFIED_HANDLE modified = modified_create();
    if (modified == NULL)
    {
        LogError("Cannot create MODIFIED delivery state handle");
        result = NULL;
    }
    else
    {
        if (modified_set_delivery_failed(modified, delivery_failed) != 0)
        {
            LogError("Cannot set delivery failed on MODIFIED delivery state");
            result = NULL;
        }
        else if (modified_set_undeliverable_here(modified, undeliverable_here) != 0)
        {
            LogError("Cannot set undeliverable here on MODIFIED delivery state");
            result = NULL;
        }
        else if ((message_annotations != NULL) && (modified_set_message_annotations(modified, message_annotations) != 0))
        {
            LogError("Cannot set message annotations on MODIFIED delivery state");
            result = NULL;
        }
        else
        {
            result = amqpvalue_create_modified(modified);
            if (result == NULL)
            {
                LogError("Cannot create MODIFIED delivery state AMQP value");
            }
            else
            {
                /* all ok */
            }
        }

        modified_destroy(modified);
    }

    return result;
}